

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

Socket * __thiscall asl::Socket::operator>>(Socket *this,longlong *x)

{
  SmartObject_ *pSVar1;
  ulong uVar2;
  
  pSVar1 = (this->super_SmartObject)._p;
  (*pSVar1->_vptr_SmartObject_[0xd])(pSVar1,x,8);
  if (*(int *)((long)&(this->super_SmartObject)._p[1]._vptr_SmartObject_ + 4) == 0) {
    uVar2 = *x;
    *x = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  }
  return this;
}

Assistant:

Socket& operator>>(T& x)
	{
		read(&x, sizeof(x));
		if (endian() == ASL_OTHER_ENDIAN)
			swapBytes(x);
		return *this;
	}